

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauTree.c
# Opt level: O0

int Dss_ManOperation(Dss_Man_t *p,int Type,int *pLits,int nLits,uchar *pPerm,word *pTruth)

{
  Vec_Ptr_t *p_00;
  Vec_Int_t *p_01;
  int iVar1;
  uint uVar2;
  int iVar3;
  Dss_Obj_t *pDVar4;
  bool bVar5;
  bool local_119;
  bool local_105;
  int local_100;
  int t;
  int nSSize;
  int j;
  int pBegEnd [12];
  uint local_b8;
  int fComplFan;
  int fCompl;
  int nChildren;
  int k;
  int i;
  Dss_Obj_t *pChild;
  Dss_Obj_t *pObj;
  Dss_Obj_t *pChildren [12];
  word *pTruth_local;
  uchar *pPerm_local;
  int nLits_local;
  int *pLits_local;
  int Type_local;
  Dss_Man_t *p_local;
  
  fComplFan = 0;
  local_b8 = 0;
  pChildren[0xb] = (Dss_Obj_t *)pTruth;
  if ((Type != 3) && (pPerm != (uchar *)0x0)) {
    __assert_fail("Type == DAU_DSD_AND || pPerm == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauTree.c"
                  ,0x50d,
                  "int Dss_ManOperation(Dss_Man_t *, int, int *, int, unsigned char *, word *)");
  }
  if ((Type == 3) && (pPerm != (uchar *)0x0)) {
    local_100 = 0;
    for (fCompl = 0; fCompl < nLits; fCompl = fCompl + 1) {
      pChild = Dss_Lit2Obj(p->vObjs,pLits[fCompl]);
      iVar1 = Dss_IsComplement(pChild);
      if ((iVar1 == 0) && ((*(uint *)&pChild->field_0x4 & 7) == 3)) {
        nChildren = 0;
        while( true ) {
          iVar1 = Dss_ObjFaninNum(pChild);
          bVar5 = false;
          if (nChildren < iVar1) {
            _k = Dss_ObjChild(p->vObjs,pChild,nChildren);
            bVar5 = _k != (Dss_Obj_t *)0x0;
          }
          if (!bVar5) break;
          pDVar4 = Dss_Regular(_k);
          local_119 = false;
          if ((*(uint *)&pDVar4->field_0x4 & 7) == 2) {
            iVar1 = Dss_IsComplement(_k);
            local_119 = iVar1 != 0;
          }
          if (local_119 != 0) {
            _k = Dss_Regular(_k);
          }
          pDVar4 = Dss_Regular(_k);
          (&nSSize)[fComplFan] =
               local_100 << 0x10 | (uint)local_119 << 8 |
               local_100 + (*(uint *)&pDVar4->field_0x4 >> 3 & 0xff);
          pDVar4 = Dss_Regular(_k);
          local_100 = (*(uint *)&pDVar4->field_0x4 >> 3 & 0xff) + local_100;
          pChildren[(long)fComplFan + -1] = _k;
          nChildren = nChildren + 1;
          fComplFan = fComplFan + 1;
        }
      }
      else {
        pDVar4 = Dss_Regular(pChild);
        local_105 = false;
        if ((*(uint *)&pDVar4->field_0x4 & 7) == 2) {
          iVar1 = Dss_IsComplement(pChild);
          local_105 = iVar1 != 0;
        }
        if (local_105 != 0) {
          pChild = Dss_Regular(pChild);
        }
        pDVar4 = Dss_Regular(pChild);
        (&nSSize)[fComplFan] =
             local_100 << 0x10 | (uint)local_105 << 8 |
             local_100 + (*(uint *)&pDVar4->field_0x4 >> 3 & 0xff);
        pDVar4 = Dss_Regular(pChild);
        local_100 = (*(uint *)&pDVar4->field_0x4 >> 3 & 0xff) + local_100;
        pChildren[(long)fComplFan + -1] = pChild;
        fComplFan = fComplFan + 1;
      }
    }
    Dss_ObjSort(p->vObjs,&pObj,fComplFan,&nSSize);
    t = 0;
    for (nChildren = 0; nChildren < fComplFan; nChildren = nChildren + 1) {
      for (fCompl = (&nSSize)[nChildren] >> 0x10; fCompl < (int)((&nSSize)[nChildren] & 0xffU);
          fCompl = fCompl + 1) {
        iVar1 = Abc_Var2Lit(fCompl,(&nSSize)[nChildren] >> 8 & 1);
        pPerm[t] = (uchar)iVar1;
        t = t + 1;
      }
    }
    if (t != local_100) {
      __assert_fail("j == nSSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauTree.c"
                    ,0x52e,
                    "int Dss_ManOperation(Dss_Man_t *, int, int *, int, unsigned char *, word *)");
    }
  }
  else if (Type == 3) {
    for (fCompl = 0; fCompl < nLits; fCompl = fCompl + 1) {
      pDVar4 = Dss_Lit2Obj(p->vObjs,pLits[fCompl]);
      iVar1 = Dss_IsComplement(pDVar4);
      if ((iVar1 == 0) && ((*(uint *)&pDVar4->field_0x4 & 7) == 3)) {
        nChildren = 0;
        while( true ) {
          iVar1 = Dss_ObjFaninNum(pDVar4);
          bVar5 = false;
          if (nChildren < iVar1) {
            _k = Dss_ObjChild(p->vObjs,pDVar4,nChildren);
            bVar5 = _k != (Dss_Obj_t *)0x0;
          }
          if (!bVar5) break;
          pChildren[(long)fComplFan + -1] = _k;
          nChildren = nChildren + 1;
          fComplFan = fComplFan + 1;
        }
      }
      else {
        pChildren[(long)fComplFan + -1] = pDVar4;
        fComplFan = fComplFan + 1;
      }
    }
    Dss_ObjSort(p->vObjs,&pObj,fComplFan,(int *)0x0);
  }
  else if (Type == 4) {
    for (fCompl = 0; fCompl < nLits; fCompl = fCompl + 1) {
      uVar2 = Abc_LitIsCompl(pLits[fCompl]);
      local_b8 = uVar2 ^ local_b8;
      p_00 = p->vObjs;
      iVar1 = Abc_LitRegular(pLits[fCompl]);
      pDVar4 = Dss_Lit2Obj(p_00,iVar1);
      if ((*(uint *)&pDVar4->field_0x4 & 7) == 4) {
        nChildren = 0;
        while( true ) {
          iVar1 = Dss_ObjFaninNum(pDVar4);
          bVar5 = false;
          if (nChildren < iVar1) {
            _k = Dss_ObjChild(p->vObjs,pDVar4,nChildren);
            bVar5 = _k != (Dss_Obj_t *)0x0;
          }
          if (!bVar5) break;
          iVar1 = Dss_IsComplement(_k);
          if (iVar1 != 0) {
            __assert_fail("!Dss_IsComplement(pChild)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauTree.c"
                          ,0x548,
                          "int Dss_ManOperation(Dss_Man_t *, int, int *, int, unsigned char *, word *)"
                         );
          }
          pChildren[(long)fComplFan + -1] = _k;
          nChildren = nChildren + 1;
          fComplFan = fComplFan + 1;
        }
      }
      else {
        pChildren[(long)fComplFan + -1] = pDVar4;
        fComplFan = fComplFan + 1;
      }
    }
    Dss_ObjSort(p->vObjs,&pObj,fComplFan,(int *)0x0);
  }
  else if (Type == 5) {
    iVar1 = Abc_LitIsCompl(*pLits);
    if (iVar1 != 0) {
      iVar1 = Abc_LitNot(*pLits);
      *pLits = iVar1;
      iVar1 = pLits[1];
      pLits[1] = pLits[2];
      pLits[2] = iVar1;
    }
    iVar1 = Abc_LitIsCompl(pLits[1]);
    if (iVar1 != 0) {
      iVar3 = Abc_LitNot(pLits[1]);
      pLits[1] = iVar3;
      iVar3 = Abc_LitNot(pLits[2]);
      pLits[2] = iVar3;
    }
    local_b8 = (uint)(iVar1 != 0);
    for (fCompl = 0; fCompl < nLits; fCompl = fCompl + 1) {
      pDVar4 = Dss_Lit2Obj(p->vObjs,pLits[fCompl]);
      pChildren[(long)fComplFan + -1] = pDVar4;
      fComplFan = fComplFan + 1;
    }
  }
  else {
    if (Type != 6) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauTree.c"
                    ,0x563,
                    "int Dss_ManOperation(Dss_Man_t *, int, int *, int, unsigned char *, word *)");
    }
    for (fCompl = 0; fCompl < nLits; fCompl = fCompl + 1) {
      pDVar4 = Dss_Lit2Obj(p->vObjs,pLits[fCompl]);
      pChildren[(long)fComplFan + -1] = pDVar4;
      fComplFan = fComplFan + 1;
    }
  }
  Vec_IntClear(p->vLeaves);
  for (nChildren = 0; nChildren < fComplFan; nChildren = nChildren + 1) {
    p_01 = p->vLeaves;
    iVar1 = Dss_Obj2Lit(pChildren[(long)nChildren + -1]);
    Vec_IntPush(p_01,iVar1);
  }
  pDVar4 = Dss_ObjFindOrAdd(p,Type,p->vLeaves,(word *)pChildren[0xb]);
  iVar1 = Abc_Var2Lit(pDVar4->Id,local_b8);
  return iVar1;
}

Assistant:

int Dss_ManOperation( Dss_Man_t * p, int Type, int * pLits, int nLits, unsigned char * pPerm, word * pTruth )
{
    Dss_Obj_t * pChildren[DAU_MAX_VAR];
    Dss_Obj_t * pObj, * pChild;
    int i, k, nChildren = 0, fCompl = 0, fComplFan;

    assert( Type == DAU_DSD_AND || pPerm == NULL );
    if ( Type == DAU_DSD_AND && pPerm != NULL )
    {
        int pBegEnd[DAU_MAX_VAR];
        int j, nSSize = 0;
        for ( k = 0; k < nLits; k++ )
        {
            pObj = Dss_Lit2Obj(p->vObjs, pLits[k]);
            if ( Dss_IsComplement(pObj) || pObj->Type != DAU_DSD_AND )
            {
                fComplFan = (Dss_Regular(pObj)->Type == DAU_DSD_VAR && Dss_IsComplement(pObj));
                if ( fComplFan )
                    pObj = Dss_Regular(pObj);
                pBegEnd[nChildren] = (nSSize << 16) | (fComplFan << 8) | (nSSize + Dss_Regular(pObj)->nSupp);
                nSSize += Dss_Regular(pObj)->nSupp;
                pChildren[nChildren++] = pObj;
            }
            else
                Dss_ObjForEachChild( p->vObjs, pObj, pChild, i )
                {
                    fComplFan = (Dss_Regular(pChild)->Type == DAU_DSD_VAR && Dss_IsComplement(pChild));
                    if ( fComplFan )
                        pChild = Dss_Regular(pChild);
                    pBegEnd[nChildren] = (nSSize << 16) | (fComplFan << 8) | (nSSize + Dss_Regular(pChild)->nSupp);
                    nSSize += Dss_Regular(pChild)->nSupp;
                    pChildren[nChildren++] = pChild;
                }
        }
        Dss_ObjSort( p->vObjs, pChildren, nChildren, pBegEnd );
        // create permutation
        for ( j = i = 0; i < nChildren; i++ )
            for ( k = (pBegEnd[i] >> 16); k < (pBegEnd[i] & 0xFF); k++ )
                pPerm[j++] = (unsigned char)Abc_Var2Lit( k, (pBegEnd[i] >> 8) & 1 );
        assert( j == nSSize );
    }
    else if ( Type == DAU_DSD_AND )
    {
        for ( k = 0; k < nLits; k++ )
        {
            pObj = Dss_Lit2Obj(p->vObjs, pLits[k]);
            if ( Dss_IsComplement(pObj) || pObj->Type != DAU_DSD_AND )
                pChildren[nChildren++] = pObj;
            else
                Dss_ObjForEachChild( p->vObjs, pObj, pChild, i )
                    pChildren[nChildren++] = pChild;
        }
        Dss_ObjSort( p->vObjs, pChildren, nChildren, NULL );
    }
    else if ( Type == DAU_DSD_XOR )
    {
        for ( k = 0; k < nLits; k++ )
        {
            fCompl ^= Abc_LitIsCompl(pLits[k]);
            pObj = Dss_Lit2Obj(p->vObjs, Abc_LitRegular(pLits[k]));
            if ( pObj->Type != DAU_DSD_XOR )
                pChildren[nChildren++] = pObj;
            else
                Dss_ObjForEachChild( p->vObjs, pObj, pChild, i )
                {
                    assert( !Dss_IsComplement(pChild) );
                    pChildren[nChildren++] = pChild;
                }
        }
        Dss_ObjSort( p->vObjs, pChildren, nChildren, NULL );
    }
    else if ( Type == DAU_DSD_MUX )
    {
        if ( Abc_LitIsCompl(pLits[0]) )
        {
            pLits[0] = Abc_LitNot(pLits[0]);
            ABC_SWAP( int, pLits[1], pLits[2] );
        }
        if ( Abc_LitIsCompl(pLits[1]) )
        {
            pLits[1] = Abc_LitNot(pLits[1]);
            pLits[2] = Abc_LitNot(pLits[2]);
            fCompl ^= 1;
        }
        for ( k = 0; k < nLits; k++ )
            pChildren[nChildren++] = Dss_Lit2Obj(p->vObjs, pLits[k]);
    }
    else if ( Type == DAU_DSD_PRIME )
    {
        for ( k = 0; k < nLits; k++ )
            pChildren[nChildren++] = Dss_Lit2Obj(p->vObjs, pLits[k]);
    }
    else assert( 0 );

    // shift subgraphs
    Vec_IntClear( p->vLeaves );
    for ( i = 0; i < nChildren; i++ )
        Vec_IntPush( p->vLeaves, Dss_Obj2Lit(pChildren[i]) );
    // create new graph
    pObj = Dss_ObjFindOrAdd( p, Type, p->vLeaves, pTruth );
    return Abc_Var2Lit( pObj->Id, fCompl );
}